

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_01;
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar3;
  int iVar4;
  int32_t iVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = ConsumeEndOfDeclaration(this,text,message_location);
  if (bVar1) {
    text_00._M_str = "}";
    text_00._M_len = 1;
    bVar1 = TryConsumeEndOfDeclaration(this,text_00,(LocationRecorder *)0x0);
    while( true ) {
      if (bVar1) {
        if (0 < *(int *)((long)&message->field_0 + 0x58)) {
          bVar1 = compiler::anon_unknown_0::IsMessageSetWireFormatMessage(message);
          iVar5 = 0x20000000;
          if (bVar1) {
            iVar5 = 0x7fffffff;
          }
          if (0 < *(int *)((long)&message->field_0 + 0x58)) {
            this_00 = &(message->field_0)._impl_.extension_range_;
            iVar4 = 0;
            do {
              pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                 (&this_00->super_RepeatedPtrFieldBase,iVar4);
              if ((pVVar2->field_0)._impl_.end_ == -1) {
                pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
                         Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                   (&this_00->super_RepeatedPtrFieldBase,iVar4);
                (pVVar2->field_0)._impl_.end_ = iVar5;
                *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 4;
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < *(int *)((long)&message->field_0 + 0x58));
          }
        }
        if (0 < *(int *)((long)&message->field_0 + 0xa0)) {
          bVar1 = compiler::anon_unknown_0::IsMessageSetWireFormatMessage(message);
          iVar5 = 0x20000000;
          if (bVar1) {
            iVar5 = 0x7fffffff;
          }
          if (0 < *(int *)((long)&message->field_0 + 0xa0)) {
            this_01 = &(message->field_0)._impl_.reserved_range_;
            iVar4 = 0;
            do {
              pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                 (&this_01->super_RepeatedPtrFieldBase,iVar4);
              if ((pVVar3->field_0)._impl_.end_ == -1) {
                pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
                         Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                   (&this_01->super_RepeatedPtrFieldBase,iVar4);
                (pVVar3->field_0)._impl_.end_ = iVar5;
                *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < *(int *)((long)&message->field_0 + 0xa0));
          }
        }
        bVar1 = ValidateMessage(this,message);
        return bVar1;
      }
      if ((this->input_->current_).type == TYPE_END) break;
      bVar1 = ParseMessageStatement(this,message,message_location,containing_file);
      if (!bVar1) {
        SkipStatement(this);
      }
      text_01._M_str = "}";
      text_01._M_len = 1;
      bVar1 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
    }
    RecordError(this,(ErrorMaker)ZEXT816(0x65cc20));
  }
  return false;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  if (message->reserved_range_size() > 0) {
    AdjustReservedRangesWithMaxEndNumber(message);
  }

  DO(ValidateMessage(message));

  return true;
}